

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O0

void __thiscall
Kernel::Clause::collectVars2<Kernel::UnstableVarIt>
          (Clause *this,DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *acc)

{
  bool bVar1;
  UnstableVarIt *in_RSI;
  TermList var;
  UnstableVarIt vit;
  Literal *lit;
  StlIter __end2;
  StlIter __begin2;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  *__range2;
  undefined4 in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  UnstableVarIt *in_stack_ffffffffffffff20;
  TermList in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  TermList local_c8 [10];
  UnstableVarIt *in_stack_ffffffffffffff88;
  Term *in_stack_ffffffffffffff98;
  UnstableVarIt *in_stack_ffffffffffffffa0;
  undefined1 local_30 [24];
  undefined1 *local_18;
  UnstableVarIt *local_10;
  
  local_10 = in_RSI;
  iterLits((Clause *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  local_18 = local_30;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
  ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
           *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
  ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
         *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  while( true ) {
    bVar1 = Lib::operator!=((StlIter *)in_stack_ffffffffffffff20,
                            (StlIter *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                           );
    if (!bVar1) break;
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
    ::StlIter::operator*((StlIter *)0x8465a1);
    UnstableVarIt::UnstableVarIt(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    while( true ) {
      bVar1 = UnstableVarIt::hasNext(in_stack_ffffffffffffff88);
      if (!bVar1) break;
      in_stack_ffffffffffffff28 = UnstableVarIt::next(in_stack_ffffffffffffff28._content);
      in_stack_ffffffffffffff20 = local_10;
      local_c8[0] = in_stack_ffffffffffffff28;
      TermList::var(local_c8);
      Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                ((DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                 in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    }
    UnstableVarIt::~UnstableVarIt(in_stack_ffffffffffffff20);
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
    ::StlIter::operator++((StlIter *)in_stack_ffffffffffffff20);
  }
  return;
}

Assistant:

void Clause::collectVars2(DHSet<unsigned>& acc)
{
  for (Literal* lit : iterLits()) {
    VarIt vit(lit);
    while (vit.hasNext()) {
      TermList var = vit.next();
      ASS(var.isOrdinaryVar());
      acc.insert(var.var());
    }
  }
}